

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::Transaction::SetTxOutValue(Transaction *this,uint32_t index,Amount *value)

{
  void *pvVar1;
  long lVar2;
  pointer pTVar3;
  ulong uVar4;
  int64_t iVar5;
  undefined4 in_register_00000034;
  
  uVar4 = (ulong)index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x2d8,"SetTxOutValue");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if (pvVar1 != (void *)0x0) {
    lVar2 = *(long *)((long)pvVar1 + 0x20);
    iVar5 = Amount::GetSatoshiValue(value);
    *(int64_t *)(lVar2 + uVar4 * 0x70) = iVar5;
    pTVar3 = (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*pTVar3[uVar4].super_AbstractTxOut._vptr_AbstractTxOut[2])(pTVar3 + uVar4,value);
    return;
  }
  return;
}

Assistant:

void Transaction::SetTxOutValue(uint32_t index, const Amount &value) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    struct wally_tx_output *output = tx_pointer->outputs + index;
    output->satoshi = static_cast<uint64_t>(value.GetSatoshiValue());

    vout_[index].SetValue(value);
    // CallbackStateChange(kStateChangeAddTxOut);
  }
}